

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O1

void __thiscall
amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
          (FabArray<amrex::FArrayBox> *this,int scomp,int ncomp,Periodicity *period,bool cross)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (this->super_FabArrayBase).n_grow.vect[0];
  iVar2 = (this->super_FabArrayBase).n_grow.vect[1];
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  iVar1 = (this->super_FabArrayBase).n_grow.vect[2];
  if (iVar2 <= iVar1) {
    iVar2 = iVar1;
  }
  if (0 < iVar2) {
    FBEP_nowait<double,_amrex::FArrayBox,_0>
              (this,scomp,ncomp,&(this->super_FabArrayBase).n_grow,period,cross,false,false);
  }
  return;
}

Assistant:

void
FabArray<FAB>::FillBoundary (int scomp, int ncomp, const Periodicity& period, bool cross)
{
    BL_PROFILE("FabArray::FillBoundary()");
    if ( n_grow.max() > 0 ) {
        FillBoundary_nowait<BUF>(scomp, ncomp, n_grow, period, cross);
        FillBoundary_finish<BUF>();
    }
}